

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall
slang::driver::Driver::processCommandFile(Driver *this,string_view fileName,bool makeRelative)

{
  pointer pbVar1;
  string_view text;
  string_view text_00;
  bool bVar2;
  undefined7 extraout_var;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  undefined4 uVar3;
  pointer pbVar4;
  string_view argList;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  undefined4 uStack_f8;
  undefined4 local_f4;
  path currPath;
  vector<char,_std::allocator<char>_> buffer;
  path local_a8;
  pointer local_78;
  size_type sStack_70;
  path path;
  error_code ec;
  
  std::_V2::system_category();
  local_a8._M_pathname._M_dataplus._M_p = (char *)fileName._M_len;
  local_a8._M_pathname._M_string_length = (size_type)fileName._M_str;
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&currPath,(basic_string_view<char,_std::char_traits<char>_> *)&local_a8,auto_format);
  std::filesystem::canonical(&path,(error_code *)&currPath);
  std::filesystem::__cxx11::path::~path(&currPath);
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  bVar2 = OS::readFile(&path,&buffer);
  if (bVar2) {
    std::filesystem::__cxx11::path::path(&currPath);
    if (makeRelative) {
      std::filesystem::current_path_abi_cxx11_();
      std::filesystem::__cxx11::path::operator=(&currPath,&local_a8);
      std::filesystem::__cxx11::path::~path(&local_a8);
      std::filesystem::__cxx11::path::parent_path();
      std::filesystem::current_path(&local_a8);
      std::filesystem::__cxx11::path::~path(&local_a8);
    }
    if (buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      assert::assertFailed
                ("!buffer.empty()",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/driver/Driver.cpp"
                 ,0xfd,"bool slang::driver::Driver::processCommandFile(string_view, bool)");
    }
    buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish
         = buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_finish + -1;
    argList._M_len =
         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    argList._M_str =
         buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_start;
    bVar2 = CommandLine::parse(&this->cmdLine,argList,(ParseOptions)0x1010101);
    if (makeRelative) {
      std::filesystem::current_path(&currPath);
    }
    uVar3 = (undefined4)CONCAT71(extraout_var,bVar2);
    if (!bVar2) {
      pbVar1 = (this->cmdLine).errors.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (pbVar4 = (this->cmdLine).errors.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1
          ) {
        local_78 = (pbVar4->_M_dataplus)._M_p;
        sStack_70 = pbVar4->_M_string_length;
        args_00.field_1.args_ = in_R9.args_;
        args_00.desc_ = (unsigned_long_long)&local_78;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = (char *)0x3;
        ::fmt::v9::vformat_abi_cxx11_(&local_a8._M_pathname,(v9 *)0x33e25a,fmt_00,args_00);
        text_00._M_len._4_4_ = uVar3;
        text_00._M_len._0_4_ = uStack_f8;
        text_00._M_str = currPath._M_pathname._M_dataplus._M_p;
        OS::printE(text_00);
        std::__cxx11::string::~string((string *)&local_a8);
      }
    }
    std::filesystem::__cxx11::path::~path(&currPath);
  }
  else {
    currPath._M_pathname._M_dataplus._M_p =
         (pointer)((ulong)((this->diagClient).
                           super___shared_ptr<slang::TextDiagnosticClient,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->errorColor << 0x20);
    currPath._M_pathname._M_string_length._0_1_ = 0;
    currPath._M_pathname._M_string_length._4_1_ = 0;
    currPath._M_pathname.field_2._M_local_buf[2] = '\0';
    currPath._M_pathname.field_2._M_allocated_capacity._0_2_ = 1;
    OS::printE((OS *)&currPath,(text_style *)0x7,(string_view)ZEXT816(0x33e067));
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_a8;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x20;
    local_a8._M_pathname._M_dataplus._M_p = fileName._M_str;
    local_a8._M_pathname._M_string_length = (size_type)fileName._M_len;
    ::fmt::v9::vformat_abi_cxx11_
              (&currPath._M_pathname,(v9 *)"no such file or directory: \'{}\'\n",fmt,args);
    text._M_len._4_4_ = local_f4;
    text._M_len._0_4_ = uStack_f8;
    text._M_str = currPath._M_pathname._M_dataplus._M_p;
    OS::printE(text);
    std::__cxx11::string::~string((string *)&currPath);
    uVar3 = 0;
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&buffer.super__Vector_base<char,_std::allocator<char>_>);
  std::filesystem::__cxx11::path::~path(&path);
  return SUB41(uVar3,0);
}

Assistant:

bool Driver::processCommandFile(string_view fileName, bool makeRelative) {
    std::error_code ec;
    fs::path path = fs::canonical(widen(fileName), ec);
    std::vector<char> buffer;
    if (ec || !OS::readFile(path, buffer)) {
        OS::printE(fg(diagClient->errorColor), "error: ");
        OS::printE(fmt::format("no such file or directory: '{}'\n", fileName));
        return false;
    }

    fs::path currPath;
    if (makeRelative) {
        currPath = fs::current_path();
        fs::current_path(path.parent_path());
    }

    CommandLine::ParseOptions parseOpts;
    parseOpts.expandEnvVars = true;
    parseOpts.ignoreProgramName = true;
    parseOpts.supportComments = true;
    parseOpts.ignoreDuplicates = true;

    ASSERT(!buffer.empty());
    buffer.pop_back();

    string_view argStr(buffer.data(), buffer.size());
    bool result = cmdLine.parse(argStr, parseOpts);

    if (makeRelative)
        fs::current_path(currPath);

    if (!result) {
        for (auto& err : cmdLine.getErrors())
            OS::printE(fmt::format("{}\n", err));
        return false;
    }

    return true;
}